

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  undefined1 local_38 [8];
  ucvector data;
  uint error;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  data.allocsize._4_4_ = 0;
  ucvector_init((ucvector *)local_38);
  lodepng_add32bitInt((ucvector *)local_38,info->phys_x);
  lodepng_add32bitInt((ucvector *)local_38,info->phys_y);
  ucvector_push_back((ucvector *)local_38,(uchar)info->phys_unit);
  data.allocsize._4_4_ = addChunk(out,"pHYs",(uchar *)local_38,(size_t)data.data);
  ucvector_cleanup(local_38);
  return data.allocsize._4_4_;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector data;
  ucvector_init(&data);

  lodepng_add32bitInt(&data, info->phys_x);
  lodepng_add32bitInt(&data, info->phys_y);
  ucvector_push_back(&data, info->phys_unit);

  error = addChunk(out, "pHYs", data.data, data.size);
  ucvector_cleanup(&data);

  return error;
}